

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O3

int Bac_ObjAlloc(Bac_Ntk_t *p,Bac_ObjType_t Type,int Fanin)

{
  int Entry;
  uint uVar1;
  int iVar2;
  size_t __size;
  char *pcVar3;
  long lVar4;
  
  Entry = (p->vType).nSize;
  if (Entry != (p->vFanin).nSize) {
    __assert_fail("iObj == Vec_IntSize(&p->vFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0x19f,"int Bac_ObjAlloc(Bac_Ntk_t *, Bac_ObjType_t, int)");
  }
  if (Type == BAC_OBJ_PI) {
    lVar4 = 0x20;
  }
  else {
    if (Type != BAC_OBJ_PO) {
      if ((int)Type < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      goto LAB_008bd545;
    }
    lVar4 = 0x30;
  }
  Vec_IntPush((Vec_Int_t *)((long)&p->pDesign + lVar4),Entry);
LAB_008bd545:
  uVar1 = (p->vType).nSize;
  if (uVar1 == (p->vType).nCap) {
    if ((int)uVar1 < 0x10) {
      pcVar3 = (p->vType).pArray;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(pcVar3,0x10);
      }
      (p->vType).pArray = pcVar3;
      (p->vType).nCap = 0x10;
    }
    else {
      __size = (ulong)uVar1 * 2;
      pcVar3 = (p->vType).pArray;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)malloc(__size);
      }
      else {
        pcVar3 = (char *)realloc(pcVar3,__size);
      }
      (p->vType).pArray = pcVar3;
      (p->vType).nCap = (int)__size;
    }
  }
  else {
    pcVar3 = (p->vType).pArray;
  }
  iVar2 = (p->vType).nSize;
  (p->vType).nSize = iVar2 + 1;
  pcVar3[iVar2] = (char)Type * '\x02';
  Vec_IntPush(&p->vFanin,Fanin);
  return Entry;
}

Assistant:

static inline int Bac_ObjAlloc( Bac_Ntk_t * p, Bac_ObjType_t Type, int Fanin )
{
    int iObj = Bac_NtkObjNum(p);
    assert( iObj == Vec_IntSize(&p->vFanin) );
    if ( Type == BAC_OBJ_PI )
        Vec_IntPush( &p->vInputs, iObj );
    else if ( Type == BAC_OBJ_PO )
        Vec_IntPush( &p->vOutputs, iObj );
    Vec_StrPush( &p->vType, (char)Abc_Var2Lit(Type, 0) );
    Vec_IntPush( &p->vFanin, Fanin );
    return iObj;
}